

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_int,unsigned_short>
          (Thread *this,BinopFunc<unsigned_short,_unsigned_short> *f,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  uint uVar3;
  RefVec *this_00;
  const_reference pvVar4;
  Memory *this_01;
  string local_98;
  Ptr local_78;
  Enum local_60;
  ushort local_5a;
  u64 uStack_58;
  unsigned_short old;
  u64 offset;
  Ref RStack_48;
  unsigned_short val;
  undefined1 local_40 [8];
  Ptr memory;
  Ptr *out_trap_local;
  BinopFunc<unsigned_short,_unsigned_short> *f_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  out_trap_local = (Ptr *)f;
  f_local = (BinopFunc<unsigned_short,_unsigned_short> *)this;
  this_00 = Instance::memories(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RStack_48.index = pvVar4->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_40,pSVar1,RStack_48);
  uVar3 = Pop<unsigned_int>(this);
  offset._6_2_ = (unsigned_short)uVar3;
  uStack_58 = PopPtr(this,(Ptr *)local_40);
  this_01 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_40);
  local_60 = (Enum)Memory::
                   AtomicRmw<unsigned_short,unsigned_short(*&)(unsigned_short,unsigned_short)>
                             (this_01,uStack_58,(ulong)instr.field_2.imm_u32x2.snd,offset._6_2_,
                              (BinopFunc<unsigned_short,_unsigned_short> **)&out_trap_local,
                              &local_5a);
  bVar2 = Failed((Result)local_60);
  if (bVar2) {
    pSVar1 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_98,"invalid atomic access at %lu+%u",uStack_58,
               (ulong)instr.field_2.imm_u32x2.snd);
    Trap::New(&local_78,pSVar1,&local_98,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_78);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    Push<unsigned_int>(this,(uint)local_5a);
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_40);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = static_cast<T>(Pop<R>());
  u64 offset = PopPtr(memory);
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}